

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::RemoveColumn(RowGroupCollection *this,idx_t col_idx)

{
  RowGroupCollection *pRVar1;
  type removed_column;
  RowGroupSegmentTree *this_00;
  idx_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RowGroup *new_collection;
  TableStatistics *lock;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar2;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> new_row_group;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  result_lock;
  SegmentIterator __begin1;
  vector<duckdb::LogicalType,_true> new_types;
  undefined1 local_78 [16];
  atomic<duckdb::RowGroup_*> local_68;
  SegmentIterator local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  SegmentIterationHelper local_38;
  
  local_60.current = (RowGroup *)local_60.tree;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(col_idx + 0x28));
  vector<duckdb::LogicalType,_true>::erase_at((vector<duckdb::LogicalType,_true> *)&local_50,in_RDX)
  ;
  local_60.tree = *(SegmentTree<duckdb::RowGroup,_true> **)(col_idx + 0x10);
  make_shared_ptr<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((shared_ptr<duckdb::DataTableInfo,_true> *)this,(BlockManager *)(col_idx + 0x18),
             *(vector<duckdb::LogicalType,_true> **)col_idx,(unsigned_long *)&local_50,
             (unsigned_long *)(col_idx + 0x40),(unsigned_long *)&local_60);
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::InitializeRemoveColumn(&pRVar1->stats,(TableStatistics *)(col_idx + 0x58),in_RDX)
  ;
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  lock = &pRVar1->stats;
  TableStatistics::GetLock((TableStatistics *)(local_78 + 8));
  pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
             *)(local_78 + 8));
  TableStatistics::DestroyTableSample(&pRVar1->stats,(TableStatisticsLock *)lock);
  local_38.tree =
       &shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                  ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)(col_idx + 0x48))->
        super_SegmentTree<duckdb::RowGroup,_true>;
  local_60 = SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::begin(&local_38);
  new_collection = local_60.current;
  while (new_collection != (RowGroup *)0x0) {
    removed_column =
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::RemoveColumn
              ((RowGroup *)local_78,(RowGroupCollection *)new_collection,(idx_t)removed_column);
    pRVar1 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar1->row_groups);
    local_68._M_b._M_p = (__base_type)(__base_type)local_78._0_8_;
    local_78._0_8_ = (__pointer_type)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_68);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_68);
    ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)local_78);
    SegmentTree<duckdb::RowGroup,_true>::SegmentIterationHelper::SegmentIterator::Next(&local_60);
    new_collection = local_60.current;
  }
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)(local_78 + 8));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar2.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::RemoveColumn(idx_t col_idx) {
	D_ASSERT(col_idx < types.size());
	auto new_types = types;
	new_types.erase_at(col_idx);

	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);
	result->stats.InitializeRemoveColumn(stats, col_idx);

	auto result_lock = result->stats.GetLock();
	result->stats.DestroyTableSample(*result_lock);

	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.RemoveColumn(*result, col_idx);
		result->row_groups->AppendSegment(std::move(new_row_group));
	}
	return result;
}